

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

bool __thiscall kratos::PackedStruct::same(PackedStruct *this,PackedStruct *def)

{
  pointer pPVar1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar4 = 0;
  bVar6 = false;
  if ((long)(this->attributes).
            super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->attributes).
            super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
            ._M_impl.super__Vector_impl_data._M_start ==
      (long)(def->attributes).
            super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(def->attributes).
            super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    do {
      uVar5 = (ulong)uVar4;
      pPVar1 = (this->attributes).
               super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->attributes).
                     super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1) / 0x30;
      bVar6 = uVar3 <= uVar5;
      if (uVar3 <= uVar5) {
        return bVar6;
      }
      bVar2 = PackedStructFieldDef::same
                        (pPVar1 + uVar5,
                         (def->attributes).
                         super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar5);
      uVar4 = uVar4 + 1;
    } while (bVar2);
  }
  return bVar6;
}

Assistant:

bool PackedStruct::same(const PackedStruct &def) const {
    if (attributes.size() != def.attributes.size()) return false;
    for (auto i = 0u; i < attributes.size(); i++) {
        if (!attributes[i].same(def.attributes[i])) return false;
    }
    return true;
}